

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O2

int priv_encdec_stub(char *name,_func_int_int_uchar_ptr_uchar_ptr_RSA_ptr_int *func,expbuf_t *buf)

{
  size_t *psVar1;
  size_t key_index;
  size_t sVar2;
  uint uVar3;
  uchar *puVar4;
  int *piVar5;
  RSA *r;
  ulong l;
  size_t flen;
  uchar to [4096];
  
  puVar4 = (uchar *)expbuf_shift_bytes(buf,&flen);
  if (puVar4 != (uchar *)0x0) {
    psVar1 = (size_t *)buf->start;
    if (7 < (ulong)((long)buf->end - (long)psVar1)) {
      key_index = *psVar1;
      buf->start = (char *)(psVar1 + 1);
      if (7 < (ulong)((long)buf->end - (long)(psVar1 + 1))) {
        sVar2 = psVar1[1];
        buf->start = (char *)(psVar1 + 2);
        r = (RSA *)daemon_get_rsa(key_index);
        if (r == (RSA *)0x0) {
          piVar5 = __errno_location();
          *piVar5 = 0;
          warnf("%s: invalid key index:%zu\n",name,key_index);
          return -1;
        }
        uVar3 = (*func)((int)flen,puVar4,to,(RSA *)r,(int)sVar2);
        expbuf_dispose(buf);
        RSA_free(r);
        expbuf_push_num(buf,(long)(int)uVar3);
        l = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          l = 0;
        }
        expbuf_push_bytes(buf,to,l);
        return 0;
      }
    }
  }
  piVar5 = __errno_location();
  *piVar5 = 0;
  warnf("%s: failed to parse request",name);
  return -1;
}

Assistant:

static int priv_encdec_stub(const char *name,
                            int (*func)(int flen, const unsigned char *from, unsigned char *to, RSA *rsa, int padding),
                            struct expbuf_t *buf)
{
    unsigned char *from, to[4096];
    size_t flen;
    size_t key_index, padding;
    RSA *rsa;
    int ret;

    if ((from = expbuf_shift_bytes(buf, &flen)) == NULL || expbuf_shift_num(buf, &key_index) != 0 ||
        expbuf_shift_num(buf, &padding) != 0) {
        errno = 0;
        warnf("%s: failed to parse request", name);
        return -1;
    }
    if ((rsa = daemon_get_rsa(key_index)) == NULL) {
        errno = 0;
        warnf("%s: invalid key index:%zu\n", name, key_index);
        return -1;
    }
    ret = func((int)flen, from, to, rsa, (int)padding);
    expbuf_dispose(buf);
    RSA_free(rsa);

    expbuf_push_num(buf, ret);
    expbuf_push_bytes(buf, to, ret > 0 ? ret : 0);

    return 0;
}